

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cangw.c
# Opt level: O0

int parse_mod(char *optarg,modattr *modmsg)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  undefined4 *in_RSI;
  char *in_RDI;
  canid_t can_id;
  char hexdata [17];
  char *nptr;
  char *ptr;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  char *local_20;
  int local_4;
  
  memset(&stack0xffffffffffffffb8,0,0x11);
  local_20 = strchr(in_RDI,0x3a);
  if (((long)local_20 - (long)in_RDI < 4) && (local_20 != in_RDI)) {
    iVar1 = strncmp(in_RDI,"AND",3);
    if (iVar1 == 0) {
      *(undefined1 *)((long)in_RSI + 0x11) = 1;
    }
    else {
      iVar1 = strncmp(in_RDI,"OR",2);
      if (iVar1 == 0) {
        *(undefined1 *)((long)in_RSI + 0x11) = 2;
      }
      else {
        iVar1 = strncmp(in_RDI,"XOR",3);
        if (iVar1 == 0) {
          *(undefined1 *)((long)in_RSI + 0x11) = 3;
        }
        else {
          iVar1 = strncmp(in_RDI,"SET",3);
          if (iVar1 != 0) {
            return 2;
          }
          *(undefined1 *)((long)in_RSI + 0x11) = 4;
        }
      }
    }
    local_20 = local_20 + 1;
    pcVar2 = strchr(local_20,0x3a);
    if (((long)pcVar2 - (long)local_20 < 4) && (pcVar2 != local_20)) {
      *(undefined1 *)(in_RSI + 4) = 0;
      for (; *local_20 != ':'; local_20 = local_20 + 1) {
        in_stack_ffffffffffffffb0 = (int)*local_20;
        if (in_stack_ffffffffffffffb0 == 0x44) {
          *(byte *)(in_RSI + 4) = *(byte *)(in_RSI + 4) | 4;
        }
        else if (in_stack_ffffffffffffffb0 == 0x49) {
          *(byte *)(in_RSI + 4) = *(byte *)(in_RSI + 4) | 1;
        }
        else {
          if (in_stack_ffffffffffffffb0 != 0x4c) {
            return 4;
          }
          *(byte *)(in_RSI + 4) = *(byte *)(in_RSI + 4) | 2;
        }
      }
      iVar1 = __isoc99_sscanf(local_20 + 1,"%x.%hhx.%16s",&stack0xffffffffffffffb4,in_RSI + 1,
                              &stack0xffffffffffffffb8);
      if (iVar1 == 3) {
        *in_RSI = in_stack_ffffffffffffffb4;
        sVar3 = strlen(&stack0xffffffffffffffb8);
        if (sVar3 == 0x10) {
          iVar1 = b64hex(in_stack_ffffffffffffffb8,
                         (uchar *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac);
          if (iVar1 == 0) {
            local_4 = 0;
          }
          else {
            local_4 = 7;
          }
        }
        else {
          local_4 = 6;
        }
      }
      else {
        local_4 = 5;
      }
    }
    else {
      local_4 = 3;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int parse_mod(char *optarg, struct modattr *modmsg)
{
	char *ptr, *nptr;
	char hexdata[(CAN_MAX_DLEN * 2) + 1] = {0};
	canid_t can_id;

	ptr = optarg;
	nptr = strchr(ptr, ':');

	if ((nptr - ptr > 3) || (nptr - ptr == 0))
		return 1;

	if (!strncmp(ptr, "AND", 3))
		modmsg->instruction = CGW_MOD_AND;
	else if (!strncmp(ptr, "OR", 2))
		modmsg->instruction = CGW_MOD_OR;
	else if (!strncmp(ptr, "XOR", 3))
		modmsg->instruction = CGW_MOD_XOR;
	else if (!strncmp(ptr, "SET", 3))
		modmsg->instruction = CGW_MOD_SET;
	else
		return 2;

	ptr = nptr+1;
	nptr = strchr(ptr, ':');

	if ((nptr - ptr > 3) || (nptr - ptr == 0))
		return 3;

	modmsg->modtype = 0;

	while (*ptr != ':') {

		switch (*ptr) {

		case 'I':
			modmsg->modtype |= CGW_MOD_ID;
			break;

		case 'L':
			modmsg->modtype |= CGW_MOD_DLC;
			break;

		case 'D':
			modmsg->modtype |= CGW_MOD_DATA;
			break;

		default:
			return 4;
		}
		ptr++;
	}

	if (sscanf(++ptr, "%x.%hhx.%16s", &can_id,
		   (unsigned char *)&modmsg->cf.can_dlc, hexdata) != 3)
		return 5;

	modmsg->cf.can_id = can_id;

	if (strlen(hexdata) != (CAN_MAX_DLEN * 2))
		return 6;

	if (b64hex(hexdata, &modmsg->cf.data[0], CAN_MAX_DLEN))
		return 7;

	return 0; /* ok */
}